

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilTruth.c
# Opt level: O1

void Extra_TruthChangePhase(uint *pTruth,int nVars,int iVar)

{
  uint uVar1;
  byte bVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  uint *puVar6;
  int iVar7;
  ulong uVar8;
  
  uVar1 = 1 << ((char)nVars - 5U & 0x1f);
  if (nVars < 6) {
    uVar1 = 1;
  }
  if (nVars <= iVar) {
    __assert_fail("iVar < nVars",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilTruth.c"
                  ,0x2d5,"void Extra_TruthChangePhase(unsigned int *, int, int)");
  }
  switch(iVar) {
  case 0:
    if (0 < (int)uVar1) {
      uVar3 = 0;
      do {
        pTruth[uVar3] = (pTruth[uVar3] >> 1 & 0x55555555) + (pTruth[uVar3] & 0xd5555555) * 2;
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
    break;
  case 1:
    if (0 < (int)uVar1) {
      uVar3 = 0;
      do {
        pTruth[uVar3] = (pTruth[uVar3] >> 2 & 0x33333333) + (pTruth[uVar3] & 0xf3333333) * 4;
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
    break;
  case 2:
    if (0 < (int)uVar1) {
      uVar3 = 0;
      do {
        pTruth[uVar3] = pTruth[uVar3] >> 4 & 0xf0f0f0f | (pTruth[uVar3] & 0xf0f0f0f) << 4;
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
    break;
  case 3:
    if (0 < (int)uVar1) {
      uVar3 = 0;
      do {
        uVar5 = pTruth[uVar3];
        pTruth[uVar3] =
             ((uVar5 & 0xff00) << 8 | uVar5 << 0x18) >> 0x10 |
             (uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8) << 0x10;
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
    break;
  case 4:
    if (0 < (int)uVar1) {
      uVar3 = 0;
      do {
        puVar6 = pTruth + uVar3;
        *puVar6 = *puVar6 << 0x10 | *puVar6 >> 0x10;
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
    break;
  default:
    if (0 < (int)uVar1) {
      bVar2 = (byte)(iVar + -5);
      uVar5 = 1 << (bVar2 & 0x1f);
      iVar4 = 2 << (bVar2 & 0x1f);
      uVar3 = 1;
      if (1 < (int)uVar5) {
        uVar3 = (ulong)uVar5;
      }
      puVar6 = pTruth + (int)uVar5;
      iVar7 = 0;
      do {
        if (iVar + -5 != 0x1f) {
          uVar8 = 0;
          do {
            uVar5 = pTruth[uVar8];
            pTruth[uVar8] = puVar6[uVar8];
            puVar6[uVar8] = uVar5;
            uVar8 = uVar8 + 1;
          } while (uVar3 != uVar8);
        }
        iVar7 = iVar7 + iVar4;
        puVar6 = puVar6 + iVar4;
        pTruth = pTruth + iVar4;
      } while (iVar7 < (int)uVar1);
    }
  }
  return;
}

Assistant:

void Extra_TruthChangePhase( unsigned * pTruth, int nVars, int iVar )
{
    int nWords = Extra_TruthWordNum( nVars );
    int i, k, Step;
    unsigned Temp;

    assert( iVar < nVars );
    switch ( iVar )
    {
    case 0:
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = ((pTruth[i] & 0x55555555) << 1) | ((pTruth[i] & 0xAAAAAAAA) >> 1);
        return;
    case 1:
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = ((pTruth[i] & 0x33333333) << 2) | ((pTruth[i] & 0xCCCCCCCC) >> 2);
        return;
    case 2:
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = ((pTruth[i] & 0x0F0F0F0F) << 4) | ((pTruth[i] & 0xF0F0F0F0) >> 4);
        return;
    case 3:
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = ((pTruth[i] & 0x00FF00FF) << 8) | ((pTruth[i] & 0xFF00FF00) >> 8);
        return;
    case 4:
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = ((pTruth[i] & 0x0000FFFF) << 16) | ((pTruth[i] & 0xFFFF0000) >> 16);
        return;
    default:
        Step = (1 << (iVar - 5));
        for ( k = 0; k < nWords; k += 2*Step )
        {
            for ( i = 0; i < Step; i++ )
            {
                Temp = pTruth[i];
                pTruth[i] = pTruth[Step+i];
                pTruth[Step+i] = Temp;
            }
            pTruth += 2*Step;
        }
        return;
    }
}